

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

size_t filemgr_actual_stale_length(filemgr *file,bid_t offset,size_t length)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = (ulong)file->blocksize;
  lVar1 = ((length + offset) / uVar2 - offset / uVar2) + length;
  return (ulong)((int)((offset + lVar1) % uVar2) == file->blocksize - 1) + lVar1;
}

Assistant:

size_t filemgr_actual_stale_length(struct filemgr *file,
                                   bid_t offset,
                                   size_t length)
{
    size_t actual_len;
    bid_t start_bid, end_bid;

    start_bid = offset / file->blocksize;
    end_bid = (offset + length) / file->blocksize;

    actual_len = length + (end_bid - start_bid);
    if ((offset + actual_len) % file->blocksize ==
        file->blocksize - 1) {
        actual_len += 1;
    }

    return actual_len;
}